

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_complex.cpp
# Opt level: O1

void __thiscall test_skeleton_iterator_edge2::test_method(test_skeleton_iterator_edge2 *this)

{
  undefined8 uVar1;
  long *plVar2;
  _Rb_tree_node_base *p_Var3;
  int i;
  Vertex_handle a;
  Vertex_handle b;
  int iVar4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  Complex complex;
  Edge_handle local_148;
  char **local_130;
  undefined1 local_128;
  undefined8 local_120;
  shared_count sStack_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> local_d0;
  
  a.vertex = 0;
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex(&local_d0,10,(Visitor *)0x0);
  do {
    if (a.vertex != 0) {
      b.vertex = 0;
      do {
        Gudhi::skeleton_blocker::
        Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
        add_edge_without_blockers(&local_148,&local_d0,a,b);
        b.vertex = b.vertex + 1;
      } while (a.vertex != b.vertex);
    }
    a.vertex = a.vertex + 1;
  } while (a.vertex != 10);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::remove_edge
            (&local_148,&local_d0,(Vertex_handle)0x2,(Vertex_handle)0x3);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::remove_edge
            (&local_148,&local_d0,(Vertex_handle)0x3,(Vertex_handle)0x5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"complex.num_edges():",0x14);
  plVar2 = (long *)std::ostream::operator<<
                             ((ostream *)&std::clog,
                              (int)local_d0.skeleton.super_type.m_edges.
                                   super__List_base<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>,_std::allocator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>_>
                                   ._M_impl._M_node._M_size);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  p_Var3 = local_d0.skeleton.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start[2].super_StoredVertex.m_out_edges._M_t._M_impl.
           super__Rb_tree_header._M_header._M_left;
  p_Var5 = &local_d0.skeleton.super_type.m_vertices.
            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ._M_impl.super__Vector_impl_data._M_start[2].super_StoredVertex.m_out_edges._M_t._M_impl
            .super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    bVar6 = false;
  }
  else {
    iVar4 = 8;
    do {
      uVar1 = *(undefined8 *)(p_Var3 + 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"neighbor",8);
      std::ostream::operator<<((ostream *)&std::clog,(int)uVar1);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      if ((_Rb_tree_header *)p_Var3 != p_Var5) {
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      }
      iVar4 = iVar4 + -1;
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
    bVar6 = iVar4 == 0;
  }
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x96);
  local_120 = 0;
  sStack_118.pi_ = (sp_counted_base *)0x0;
  local_130 = &local_100;
  local_100 = "num_neigbors_seen == 8";
  local_f8 = "";
  local_148.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target._0_1_ = 0;
  local_148.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
       (unsigned_long)&PTR__lazy_ostream_00136b50;
  local_148.m_eproperty = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
  ;
  local_108 = "";
  local_128 = bVar6;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_118);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex(&local_d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_iterator_edge2) {
  const int n = 10;
  Complex complex(n);
  for (int i = 0; i < n; i++)
    for (int j = 0; j < i; j++)
      complex.add_edge_without_blockers(Vertex_handle(i), Vertex_handle(j));
  complex.remove_edge(Vertex_handle(2), Vertex_handle(3));
  complex.remove_edge(Vertex_handle(3), Vertex_handle(5));
  std::clog << "complex.num_edges():" << complex.num_edges() << std::endl;
  int num_neigbors_seen = 0;
  for (auto neighbor : complex.vertex_range(Vertex_handle(2))) {
    std::clog << "neighbor" << neighbor << std::endl;
    ++num_neigbors_seen;
  }
  BOOST_CHECK(num_neigbors_seen == 8);
}